

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O1

void iCopyColors<cCMYK,cBGRA,bModulate>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  byte bVar1;
  FSpecialColormap *pFVar2;
  EBlend EVar3;
  long lVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  byte *pbVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  
  pFVar2 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
    EVar3 = BLEND_NONE;
  }
  else {
    EVar3 = inf->blend;
  }
  switch(EVar3) {
  case BLEND_NONE:
    if (0 < count) {
      pbVar8 = pin + 3;
      lVar4 = 0;
      do {
        pout[lVar4 * 4 + 2] =
             (BYTE)(((uint)pout[lVar4 * 4 + 2] *
                    (uint)(byte)(*pbVar8 - (char)((0x100 - (uint)pbVar8[-3]) * (uint)*pbVar8 >> 8)))
                   / 0xff);
        pout[lVar4 * 4 + 1] =
             (BYTE)(((uint)pout[lVar4 * 4 + 1] *
                    (uint)(byte)(*pbVar8 - (char)((0x100 - (uint)pbVar8[-2]) * (uint)*pbVar8 >> 8)))
                   / 0xff);
        pout[lVar4 * 4] =
             (BYTE)(((uint)pout[lVar4 * 4] *
                    (uint)(byte)(*pbVar8 - (char)((0x100 - (uint)pbVar8[-1]) * (uint)*pbVar8 >> 8)))
                   / 0xff);
        pout[lVar4 * 4 + 3] = 0xff;
        lVar4 = lVar4 + 1;
        pbVar8 = pbVar8 + step;
      } while (count != (int)lVar4);
    }
    break;
  case BLEND_ICEMAP:
    if (0 < count) {
      pbVar8 = pin + 3;
      lVar4 = 0;
      do {
        bVar6 = *pbVar8;
        bVar5 = bVar6 - (char)((0x100 - (uint)pbVar8[-1]) * (uint)bVar6 >> 8);
        uVar10 = (uint)(byte)(bVar6 - (char)((0x100 - (uint)pbVar8[-2]) * (uint)bVar6 >> 8)) * 0x8f
                 + (uint)(byte)(bVar6 - (char)((0x100 - (uint)pbVar8[-3]) * (uint)bVar6 >> 8)) *
                   0x4d + ((uint)bVar5 + (uint)bVar5 * 8) * 4 >> 0xc;
        pout[lVar4 * 4 + 2] =
             (BYTE)(((uint)pout[lVar4 * 4 + 2] * (uint)IcePalette[uVar10][0]) / 0xff);
        pout[lVar4 * 4 + 1] =
             (BYTE)(((uint)pout[lVar4 * 4 + 1] * (uint)IcePalette[uVar10][1]) / 0xff);
        pout[lVar4 * 4] = (BYTE)(((uint)pout[lVar4 * 4] * (uint)IcePalette[uVar10][2]) / 0xff);
        pout[lVar4 * 4 + 3] = 0xff;
        lVar4 = lVar4 + 1;
        pbVar8 = pbVar8 + step;
      } while (count != (int)lVar4);
    }
    break;
  case BLEND_OVERLAY:
    if (0 < count) {
      pbVar8 = pin + 3;
      lVar4 = 0;
      do {
        bVar6 = *pbVar8;
        iVar9 = inf->blendcolor[3];
        bVar5 = pbVar8[-2];
        iVar15 = inf->blendcolor[1];
        bVar1 = pbVar8[-1];
        iVar7 = inf->blendcolor[2];
        pout[lVar4 * 4 + 2] =
             (BYTE)(((uint)pout[lVar4 * 4 + 2] *
                    ((uint)(byte)(bVar6 - (char)((0x100 - (uint)pbVar8[-3]) * (uint)bVar6 >> 8)) *
                     iVar9 + inf->blendcolor[0] >> 0x10 & 0xff)) / 0xff);
        pout[lVar4 * 4 + 1] =
             (BYTE)(((uint)pout[lVar4 * 4 + 1] *
                    ((uint)(byte)(bVar6 - (char)((0x100 - (uint)bVar5) * (uint)bVar6 >> 8)) * iVar9
                     + iVar15 >> 0x10 & 0xff)) / 0xff);
        pout[lVar4 * 4] =
             (BYTE)(((uint)pout[lVar4 * 4] *
                    ((uint)(byte)(bVar6 - (char)((0x100 - (uint)bVar1) * (uint)bVar6 >> 8)) * iVar9
                     + iVar7 >> 0x10 & 0xff)) / 0xff);
        pout[lVar4 * 4 + 3] = 0xff;
        lVar4 = lVar4 + 1;
        pbVar8 = pbVar8 + step;
      } while (count != (int)lVar4);
    }
    break;
  case BLEND_MODULATE:
    if (0 < count) {
      pbVar8 = pin + 3;
      lVar4 = 0;
      do {
        bVar6 = *pbVar8;
        bVar5 = pbVar8[-2];
        iVar9 = inf->blendcolor[1];
        bVar1 = pbVar8[-1];
        iVar15 = inf->blendcolor[2];
        pout[lVar4 * 4 + 2] =
             (BYTE)(((uint)pout[lVar4 * 4 + 2] *
                    ((uint)(byte)(bVar6 - (char)((0x100 - (uint)pbVar8[-3]) * (uint)bVar6 >> 8)) *
                     inf->blendcolor[0] >> 0x10 & 0xff)) / 0xff);
        pout[lVar4 * 4 + 1] =
             (BYTE)(((uint)pout[lVar4 * 4 + 1] *
                    ((uint)(byte)(bVar6 - (char)((0x100 - (uint)bVar5) * (uint)bVar6 >> 8)) * iVar9
                     >> 0x10 & 0xff)) / 0xff);
        pout[lVar4 * 4] =
             (BYTE)(((uint)pout[lVar4 * 4] *
                    ((uint)(byte)(bVar6 - (char)((0x100 - (uint)bVar1) * (uint)bVar6 >> 8)) * iVar15
                     >> 0x10 & 0xff)) / 0xff);
        pout[lVar4 * 4 + 3] = 0xff;
        lVar4 = lVar4 + 1;
        pbVar8 = pbVar8 + step;
      } while (count != (int)lVar4);
    }
    break;
  default:
    EVar3 = inf->blend;
    lVar4 = (long)EVar3;
    if (lVar4 < 0x21) {
      if ((BLEND_ICEMAP < EVar3) && (0 < count)) {
        iVar9 = 0x20 - EVar3;
        pbVar8 = pin + 3;
        lVar4 = 0;
        do {
          bVar6 = *pbVar8;
          uVar13 = (uint)(byte)(bVar6 - (char)((0x100 - (uint)pbVar8[-3]) * (uint)bVar6 >> 8));
          uVar10 = (uint)(byte)(bVar6 - (char)((0x100 - (uint)pbVar8[-2]) * (uint)bVar6 >> 8));
          bVar6 = bVar6 - (char)((0x100 - (uint)pbVar8[-1]) * (uint)bVar6 >> 8);
          iVar15 = (uVar10 * 0x8f + uVar13 * 0x4d + ((uint)bVar6 + (uint)bVar6 * 8) * 4 >> 8) *
                   (EVar3 + BLEND_MODULATE);
          iVar11 = uVar13 * iVar9 + iVar15;
          iVar7 = uVar10 * iVar9 + iVar15;
          iVar15 = (uint)bVar6 * iVar9 + iVar15;
          pout[lVar4 * 4 + 2] =
               (BYTE)(((uint)pout[lVar4 * 4 + 2] *
                      ((uint)((ulong)((long)iVar11 * 0x84210843) >> 0x24) - (iVar11 >> 0x1f) & 0xff)
                      ) / 0xff);
          pout[lVar4 * 4 + 1] =
               (BYTE)(((uint)pout[lVar4 * 4 + 1] *
                      ((uint)((ulong)((long)iVar7 * 0x84210843) >> 0x24) - (iVar7 >> 0x1f) & 0xff))
                     / 0xff);
          pout[lVar4 * 4] =
               (BYTE)(((uint)pout[lVar4 * 4] *
                      ((uint)((ulong)((long)iVar15 * 0x84210843) >> 0x24) - (iVar15 >> 0x1f) & 0xff)
                      ) / 0xff);
          pout[lVar4 * 4 + 3] = 0xff;
          lVar4 = lVar4 + 1;
          pbVar8 = pbVar8 + step;
        } while (count != (int)lVar4);
      }
    }
    else if (0 < count) {
      pbVar8 = pin + 3;
      lVar12 = 0;
      do {
        bVar6 = *pbVar8;
        bVar5 = bVar6 - (char)((0x100 - (uint)pbVar8[-1]) * (uint)bVar6 >> 8);
        uVar10 = (uint)(byte)(bVar6 - (char)((0x100 - (uint)pbVar8[-2]) * (uint)bVar6 >> 8)) * 0x8f
                 + (uint)(byte)(bVar6 - (char)((0x100 - (uint)pbVar8[-3]) * (uint)bVar6 >> 8)) *
                   0x4d + ((uint)bVar5 + (uint)bVar5 * 8) * 4;
        uVar13 = uVar10 >> 8;
        if (0xfe < uVar13) {
          uVar13 = 0xff;
        }
        uVar14 = (ulong)uVar13;
        if (uVar10 < 0x100) {
          uVar14 = 0;
        }
        bVar6 = *(byte *)((long)pFVar2 + uVar14 * 4 + lVar4 * 0x518 + -0xa700);
        bVar5 = *(byte *)((long)pFVar2 + uVar14 * 4 + lVar4 * 0x518 + -0xa6ff);
        pout[lVar12 * 4 + 2] =
             (BYTE)(((uint)pout[lVar12 * 4 + 2] *
                    (uint)*(byte *)((long)pFVar2 + uVar14 * 4 + lVar4 * 0x518 + -0xa6fe)) / 0xff);
        pout[lVar12 * 4 + 1] = (BYTE)(((uint)pout[lVar12 * 4 + 1] * (uint)bVar5) / 0xff);
        pout[lVar12 * 4] = (BYTE)(((uint)pout[lVar12 * 4] * (uint)bVar6) / 0xff);
        pout[lVar12 * 4 + 3] = 0xff;
        lVar12 = lVar12 + 1;
        pbVar8 = pbVar8 + step;
      } while (count != (int)lVar12);
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}